

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O2

bool __thiscall diy::Master::Proxy::fill_incoming(Proxy *this)

{
  _Elt_pointer pQVar1;
  IExchangeInfo *pIVar2;
  _Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>
  _Var3;
  IncomingQueues *this_00;
  undefined8 extraout_RDX;
  bool bVar4;
  undefined1 auVar5 [16];
  iterator __begin2;
  accessor access;
  iterator __end2;
  
  Catch::clara::std::
  _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::clear(&(this->incoming_)._M_t);
  this_00 = incoming(this->master_,this->gid_);
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::begin(&__begin2,this_00);
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::end(&__end2,this_00);
  auVar5._8_8_ = extraout_RDX;
  auVar5._0_8_ = __begin2.it._M_node;
  bVar4 = false;
  while (__begin2.it._M_node = auVar5._0_8_, _Var3._M_node = __begin2.it._M_node,
        __begin2.it._M_node != __end2.it._M_node) {
    critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
              *)&access,(char *)&__begin2.it._M_node[1]._M_parent,auVar5._8_4_);
    pQVar1 = ((access.x_)->
             super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>)
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((access.x_)->
        super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>).
        _M_impl.super__Deque_impl_data._M_finish._M_cur != pQVar1) {
      std::
      _Rb_tree<int,std::pair<int_const,diy::MemoryBuffer>,std::_Select1st<std::pair<int_const,diy::MemoryBuffer>>,std::less<int>,std::allocator<std::pair<int_const,diy::MemoryBuffer>>>
      ::_M_emplace_unique<int_const&,diy::MemoryBuffer>
                ((_Rb_tree<int,std::pair<int_const,diy::MemoryBuffer>,std::_Select1st<std::pair<int_const,diy::MemoryBuffer>>,std::less<int>,std::allocator<std::pair<int_const,diy::MemoryBuffer>>>
                  *)&this->incoming_,(int *)(_Var3._M_node + 1),&pQVar1->buffer_);
      Catch::clara::std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
      ::pop_front(access.x_);
      pIVar2 = this->iexchange_;
      bVar4 = true;
      if (pIVar2 != (IExchangeInfo *)0x0) {
        (**(code **)(*(long *)pIVar2 + 0x18))(pIVar2,0xffffffffffffffff);
      }
    }
    Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock(&access.lock_);
    auVar5 = std::_Rb_tree_increment(__begin2.it._M_node);
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&__end2.lock_ptr.
              super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&__begin2.lock_ptr.
              super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar4;
}

Assistant:

bool                fill_incoming() const
    {
        bool exists = false;

        incoming_.clear();

        // fill incoming_
        for (auto& x : master_->incoming(gid_))
        {
            auto access = x.second.access();
            if (!access->empty())
            {
                exists = true;
                incoming_.emplace(x.first, access->front().move());
                access->pop_front();
                if (iexchange_)
                    iexchange_->dec_work();
            }
        }

        return exists;
    }